

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ReusableStringStream *pRVar1;
  string local_58;
  undefined1 local_28 [8];
  ReusableStringStream rss;
  Approx *this_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_28);
  pRVar1 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)local_28,(char (*) [9])"Approx( ");
  Detail::stringify<double>(&local_58,&this->m_value);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_58);
  ReusableStringStream::operator<<(pRVar1,(char (*) [3])" )");
  std::__cxx11::string::~string((string *)&local_58);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_28);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }